

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAttributeDeclaration.cpp
# Opt level: O0

VALUE_CONSTRAINT __thiscall
xercesc_4_0::XSAttributeDeclaration::getConstraintType(XSAttributeDeclaration *this)

{
  DefAttTypes DVar1;
  XSAttributeDeclaration *this_local;
  
  if (this->fScope == SCOPE_GLOBAL) {
    DVar1 = XMLAttDef::getDefaultType(&this->fAttDef->super_XMLAttDef);
    if (DVar1 == DefAttTypes_Min) {
      this_local._4_4_ = VALUE_CONSTRAINT_DEFAULT;
    }
    else {
      DVar1 = XMLAttDef::getDefaultType(&this->fAttDef->super_XMLAttDef);
      if ((DVar1 != Fixed) &&
         (DVar1 = XMLAttDef::getDefaultType(&this->fAttDef->super_XMLAttDef),
         DVar1 != Required_And_Fixed)) {
        return VALUE_CONSTRAINT_NONE;
      }
      this_local._4_4_ = VALUE_CONSTRAINT_FIXED;
    }
  }
  else {
    this_local._4_4_ = VALUE_CONSTRAINT_NONE;
  }
  return this_local._4_4_;
}

Assistant:

XSConstants::VALUE_CONSTRAINT XSAttributeDeclaration::getConstraintType() const
{
    if (fScope != XSConstants::SCOPE_GLOBAL)
        return XSConstants::VALUE_CONSTRAINT_NONE;

    if (fAttDef->getDefaultType() == XMLAttDef::Default)
        return XSConstants::VALUE_CONSTRAINT_DEFAULT;

    if ((fAttDef->getDefaultType() == XMLAttDef::Fixed) ||
        (fAttDef->getDefaultType() == XMLAttDef::Required_And_Fixed))
        return XSConstants::VALUE_CONSTRAINT_FIXED;

    return XSConstants::VALUE_CONSTRAINT_NONE;
}